

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void mean_double_4_suite::test_linear_decrease(void)

{
  value_type *pvVar1;
  moment<double,_4> filter;
  value_type local_80 [2];
  basic_moment<double,_4UL,_(trial::online::with)1> local_70;
  
  local_70.member.window.super_span<double,_4UL>.member.size = 0;
  local_70.member.window.super_span<double,_4UL>.member.next = 4;
  local_70.member.mean = 0.0;
  local_70.member.window.super_span<double,_4UL>.member.data = (pointer)&local_70;
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,10.0);
  local_80[0] = local_70.member.mean;
  pvVar1 = local_80 + 1;
  local_80[1] = 10.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x118,"void mean_double_4_suite::test_linear_decrease()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,9.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 9.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","9.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x11a,"void mean_double_4_suite::test_linear_decrease()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,8.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 9.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","9.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x11c,"void mean_double_4_suite::test_linear_decrease()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,7.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 8.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","8.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x11e,"void mean_double_4_suite::test_linear_decrease()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,6.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 7.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","7.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x120,"void mean_double_4_suite::test_linear_decrease()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,5.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 6.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","6.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x122,"void mean_double_4_suite::test_linear_decrease()",local_80,pvVar1);
  return;
}

Assistant:

void test_linear_decrease()
{
    window::moment<double, 4> filter;
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    filter.push(9.0);
    TRIAL_TEST_EQ(filter.mean(), 9.5);
    filter.push(8.0);
    TRIAL_TEST_EQ(filter.mean(), 9.0);
    filter.push(7.0);
    TRIAL_TEST_EQ(filter.mean(), 8.5);
    filter.push(6.0);
    TRIAL_TEST_EQ(filter.mean(), 7.5);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.mean(), 6.5);
}